

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int reportProcessingInstruction(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  block *pbVar1;
  int iVar2;
  XML_Char *pXVar3;
  char *pcVar4;
  XML_Char *s;
  BLOCK *pBVar5;
  BLOCK *pBVar6;
  
  if (parser->m_processingInstructionHandler == (XML_ProcessingInstructionHandler)0x0) {
    if (parser->m_defaultHandler == (XML_DefaultHandler)0x0) {
      return 1;
    }
    reportDefault(parser,enc,start,end);
    return 1;
  }
  pcVar4 = start + (long)enc->minBytesPerChar * 2;
  iVar2 = (*enc->nameLength)(enc,pcVar4);
  pXVar3 = poolStoreString(&parser->m_tempPool,enc,pcVar4,pcVar4 + iVar2);
  if (pXVar3 == (XML_Char *)0x0) {
    return 0;
  }
  (parser->m_tempPool).start = (parser->m_tempPool).ptr;
  pcVar4 = (*enc->skipS)(enc,pcVar4 + iVar2);
  s = poolStoreString(&parser->m_tempPool,enc,pcVar4,end + (long)enc->minBytesPerChar * -2);
  if (s == (XML_Char *)0x0) {
    return 0;
  }
  normalizeLines(s);
  (*parser->m_processingInstructionHandler)(parser->m_handlerArg,pXVar3,s);
  pBVar6 = (parser->m_tempPool).blocks;
  pBVar5 = (parser->m_tempPool).freeBlocks;
  if (pBVar5 != (BLOCK *)0x0) {
    pbVar1 = pBVar6;
    if (pBVar6 == (BLOCK *)0x0) goto LAB_00638827;
    do {
      pBVar6 = pbVar1;
      pbVar1 = pBVar6->next;
      pBVar6->next = pBVar5;
      pBVar5 = pBVar6;
    } while (pbVar1 != (block *)0x0);
  }
  (parser->m_tempPool).freeBlocks = pBVar6;
LAB_00638827:
  (parser->m_tempPool).blocks = (BLOCK *)0x0;
  (parser->m_tempPool).end = (XML_Char *)0x0;
  (parser->m_tempPool).ptr = (XML_Char *)0x0;
  (parser->m_tempPool).start = (XML_Char *)0x0;
  return 1;
}

Assistant:

static int
reportProcessingInstruction(XML_Parser parser, const ENCODING *enc,
                            const char *start, const char *end) {
  const XML_Char *target;
  XML_Char *data;
  const char *tem;
  if (! parser->m_processingInstructionHandler) {
    if (parser->m_defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  start += enc->minBytesPerChar * 2;
  tem = start + XmlNameLength(enc, start);
  target = poolStoreString(&parser->m_tempPool, enc, start, tem);
  if (! target)
    return 0;
  poolFinish(&parser->m_tempPool);
  data = poolStoreString(&parser->m_tempPool, enc, XmlSkipS(enc, tem),
                         end - enc->minBytesPerChar * 2);
  if (! data)
    return 0;
  normalizeLines(data);
  parser->m_processingInstructionHandler(parser->m_handlerArg, target, data);
  poolClear(&parser->m_tempPool);
  return 1;
}